

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.c
# Opt level: O1

int nn_literal_resolve(char *addr,size_t addrlen,int ipv4only,sockaddr_storage *result,
                      size_t *resultlen)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *__cp;
  long lVar5;
  in_addr inaddr;
  in6_addr in6addr;
  char addrz [46];
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  char local_58 [56];
  
  if ((addrlen == 0) || (*addr != '[')) {
    if (addrlen - 0x2e < 0xffffffffffffffd1) {
      return -0x16;
    }
  }
  else {
    if (addrlen - 0x30 < 0xffffffffffffffd1) {
      return -0x16;
    }
    if (addr[addrlen - 1] != ']') {
      return -0x16;
    }
    addrlen = addrlen - 2;
    addr = addr + 1;
  }
  memcpy(local_58,addr,addrlen);
  local_58[addrlen] = '\0';
  if (ipv4only == 0) {
    __cp = local_58;
    lVar5 = 10;
    iVar1 = inet_pton(10,__cp,&local_68);
    if (iVar1 == 1) {
      if (result != (sockaddr_storage *)0x0) {
        result->ss_family = 10;
        *(undefined8 *)(result->__ss_padding + 6) = local_68;
        *(undefined8 *)(result->__ss_padding + 0xe) = uStack_60;
      }
      sVar3 = 0x1c;
      goto LAB_00128b92;
    }
    if (iVar1 != 0) goto LAB_00128bb9;
  }
  __cp = local_58;
  lVar5 = 2;
  iVar1 = inet_pton(2,__cp,&local_6c);
  if (iVar1 != 1) {
    if (iVar1 == 0) {
      return -0x16;
    }
    nn_literal_resolve_cold_1();
LAB_00128bb9:
    nn_literal_resolve_cold_2();
    if (__cp == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      pcVar4 = (char *)0x0;
      iVar1 = 0;
      do {
        if (((byte)(pcVar4[lVar5] - 0x3aU) < 0xf6) ||
           (iVar1 = (uint)(byte)(pcVar4[lVar5] - 0x30) + iVar1 * 10, 0xffff < iVar1)) {
          return -0x16;
        }
        pcVar4 = pcVar4 + 1;
      } while (__cp != pcVar4);
    }
    iVar2 = -0x16;
    if (iVar1 != 0) {
      iVar2 = iVar1;
    }
    return iVar2;
  }
  if (result != (sockaddr_storage *)0x0) {
    result->ss_family = 2;
    *(undefined4 *)(result->__ss_padding + 2) = local_6c;
  }
  sVar3 = 0x10;
LAB_00128b92:
  if (resultlen != (size_t *)0x0) {
    *resultlen = sVar3;
  }
  return 0;
}

Assistant:

int nn_literal_resolve (const char *addr, size_t addrlen,
    int ipv4only, struct sockaddr_storage *result, size_t *resultlen)
{
    int rc;
    char addrz [INET6_ADDRSTRLEN > INET_ADDRSTRLEN ?
        INET6_ADDRSTRLEN :  INET_ADDRSTRLEN];
    struct in_addr inaddr;
    struct in6_addr in6addr;

    /*  Try to treat the address as a literal string. If the size of
        the address is larger than longest possible literal, skip the step.
        If the literal in enclosed in square brackets ignore them. */
    if (addrlen > 0 && addr [0] == '[') {
        if (addr [addrlen - 1] != ']')
            return -EINVAL;
        if (addrlen - 2 + 1 > sizeof (addrz))
            return -EINVAL;
        memcpy (addrz, addr + 1, addrlen - 2);
        addrz [addrlen - 2] = 0;
    }
    else {
        if (addrlen + 1 > sizeof (addrz))
            return -EINVAL;
        memcpy (addrz, addr, addrlen);
        addrz [addrlen] = 0;
    }

    /*  Try to interpret the literal as an IPv6 address. */
    if (!ipv4only) {
        rc = nn_inet_pton (AF_INET6, addrz, &in6addr);
        if (rc == 1) {
            if (result) {
                result->ss_family = AF_INET6;
                ((struct sockaddr_in6*) result)->sin6_addr = in6addr;
             }
             if (resultlen)
                *resultlen = sizeof (struct sockaddr_in6);
            return 0;
        }
        errno_assert (rc == 0);
    }

    /*  Try to interpret the literal as an IPv4 address. */
    rc = nn_inet_pton (AF_INET, addrz, &inaddr);
    if (rc == 1) {
        if (result) {
           result->ss_family = AF_INET;
           ((struct sockaddr_in*) result)->sin_addr = inaddr;
        }
        if (resultlen)
            *resultlen = sizeof (struct sockaddr_in);
        return 0;
    }
    errno_assert (rc == 0);

    /*  The supplied string is not a valid literal address. */
    return -EINVAL;
}